

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  size_t *psVar1;
  undefined **local_270;
  memory_buffer buf;
  parse_context local_38;
  
  psVar1 = &buf.super_buffer<char>.capacity_;
  buf.super_buffer<char>.ptr_ = (char *)0x0;
  local_270 = &PTR_grow_002b8bd8;
  buf.super_buffer<char>.size_ = 500;
  local_38.format_str_.data_ = (char *)0x0;
  local_38.format_str_.size_ = 0;
  local_38.next_arg_id_ = 0;
  buf._528_8_ = &local_270;
  buf.super_buffer<char>._vptr_buffer = (_func_int **)psVar1;
  (*h.custom_.format)(h.custom_.value,&local_38,
                      (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                      (buf.store_ + 0x1f0));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,buf.super_buffer<char>._vptr_buffer,
             buf.super_buffer<char>.ptr_ + (long)buf.super_buffer<char>._vptr_buffer);
  local_270 = &PTR_grow_002b8bd8;
  if (buf.super_buffer<char>._vptr_buffer != (_func_int **)psVar1) {
    operator_delete(buf.super_buffer<char>._vptr_buffer,buf.super_buffer<char>.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }